

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

int flatcc_json_printer_table_as_root
              (flatcc_json_printer_t *ctx,void *buf,size_t bufsiz,char *fid,
              flatcc_json_printer_table_f *pf)

{
  char *pcVar1;
  int iVar2;
  
  accept_header(ctx,buf,bufsiz,fid);
  print_table_object(ctx,(void *)((ulong)*buf + (long)buf),100,pf);
  if ((ctx->indent != '\0') && (ctx->level == 0)) {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\n';
  }
  (*ctx->flush)(ctx,1);
  if (ctx->error == 0) {
    iVar2 = (*(int *)&ctx->p - *(int *)&ctx->buf) + (int)ctx->total;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int flatcc_json_printer_table_as_root(flatcc_json_printer_t *ctx,
        const void *buf, size_t bufsiz, const char *fid, flatcc_json_printer_table_f *pf)
{
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return -1;
    }
    print_table_object(ctx, read_uoffset_ptr(buf), FLATCC_JSON_PRINT_MAX_LEVELS, pf);
    print_last_nl();
    return flatcc_json_printer_get_error(ctx) ? -1 : (int)ctx->total + (int)(ctx->p - ctx->buf);
}